

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall
IlmThread_3_2::anon_unknown_5::DefaultThreadPoolProvider::setNumThreads
          (DefaultThreadPoolProvider *this,int count)

{
  long *plVar1;
  ulong uVar2;
  element_type *peVar3;
  mutex *this_00;
  long lVar4;
  long *local_50;
  pthread_mutex_t *local_48;
  ulong local_40;
  thread local_38;
  
  this_00 = &((this->_data).
              super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_threadMutex;
  std::mutex::lock(this_00);
  peVar3 = (this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar2 = (long)(peVar3->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(peVar3->_threads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_40 = (ulong)count;
  local_48 = (pthread_mutex_t *)this_00;
  if (local_40 < uVar2) {
    lockedFinish(this);
    peVar3 = (this->_data).
             super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar2 = 0;
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::resize(&peVar3->_threads,local_40);
  lVar4 = uVar2 * 8;
  for (; uVar2 < local_40; uVar2 = uVar2 + 1) {
    local_38._M_id._M_thread = (id)0;
    plVar1 = (long *)operator_new(0x30);
    *plVar1 = (long)&PTR___State_impl_00109c70;
    plVar1[1] = (long)(this->_data).
                      super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar1 + 2),
               &(this->_data).
                super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    plVar1[3] = (long)this;
    plVar1[4] = (long)threadLoop;
    plVar1[5] = 0;
    local_50 = plVar1;
    std::thread::_M_start_thread(&local_38,&local_50,0);
    if (local_50 != (long *)0x0) {
      (**(code **)(*local_50 + 8))();
    }
    std::thread::operator=
              ((thread *)
               ((long)&((((this->_data).
                          super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_threads).
                        super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                        super__Vector_impl_data._M_start)->_M_id + lVar4),&local_38);
    std::thread::~thread(&local_38);
    lVar4 = lVar4 + 8;
  }
  peVar3 = (this->_data).
           super___shared_ptr<IlmThread_3_2::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  LOCK();
  (peVar3->_threadCount).super___atomic_base<int>._M_i =
       (__int_type)
       ((ulong)((long)(peVar3->_threads).
                      super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(peVar3->_threads).
                     super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 3);
  UNLOCK();
  pthread_mutex_unlock(local_48);
  return;
}

Assistant:

void
DefaultThreadPoolProvider::setNumThreads (int count)
{
    // since we're a private class, the thread pool won't call us if
    // we aren't changing size so no need to check that...

    std::lock_guard<std::mutex> lock (_data->_threadMutex);

    size_t curThreads = _data->_threads.size ();
    size_t nToAdd     = static_cast<size_t> (count);

    if (nToAdd < curThreads)
    {
        // no easy way to only shutdown the n threads at the end of
        // the vector (well, really, guaranteeing they are the ones to
        // be woken up), so just kill all of the threads
        lockedFinish ();
        curThreads = 0;
    }

    _data->_threads.resize (nToAdd);
    for (size_t i = curThreads; i < nToAdd; ++i)
    {
        _data->_threads[i] =
            std::thread (&DefaultThreadPoolProvider::threadLoop, this, _data);
    }
    _data->_threadCount = static_cast<int> (_data->_threads.size ());
}